

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

Cba_Man_t * Cba_ManDeriveFromGia(Cba_Man_t *pOld,Gia_Man_t *pGia,int fUseXor)

{
  Gia_Obj_t *pGVar1;
  Vec_Ptr_t *pVVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint *puVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  Abc_Nam_t *pAVar12;
  Abc_Nam_t *pFuns;
  Cba_Man_t *p;
  Cba_Ntk_t *pNtk;
  Vec_Int_t *vLit2Fon;
  int *__s;
  char *pcVar13;
  Vec_Int_t *p_00;
  int *piVar14;
  Vec_Int_t *pVVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  int local_34;
  
  pcVar13 = pGia->pSpec;
  if (pOld == (Cba_Man_t *)0x0) {
    pAVar12 = (Abc_Nam_t *)0x0;
    pFuns = (Abc_Nam_t *)0x0;
  }
  else {
    pAVar12 = Abc_NamRef(pOld->pStrs);
    pFuns = Abc_NamRef(pOld->pFuns);
  }
  p = Cba_ManAlloc(pcVar13,1,pAVar12,pFuns,(Abc_Nam_t *)0x0,(Hash_IntMan_t *)0x0);
  iVar7 = Abc_NamStrFindOrAdd(p->pStrs,pGia->pName,(int *)0x0);
  pNtk = Cba_NtkAlloc(p,iVar7,pGia->vCis->nSize,pGia->vCos->nSize,1000,2000,2000);
  iVar7 = pGia->nObjs;
  iVar16 = iVar7 * 2;
  vLit2Fon = (Vec_Int_t *)malloc(0x10);
  iVar18 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar18 = iVar16;
  }
  vLit2Fon->nCap = iVar18;
  if (iVar18 == 0) {
    vLit2Fon->pArray = (int *)0x0;
    vLit2Fon->nSize = iVar16;
LAB_003d9698:
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar18 << 2);
    vLit2Fon->pArray = __s;
    vLit2Fon->nSize = iVar16;
    if (__s == (int *)0x0) goto LAB_003d9698;
    memset(__s,0xff,(long)iVar7 << 3);
  }
  pAVar12 = p->pMods;
  pcVar13 = Abc_NamStr(pNtk->pDesign->pStrs,pNtk->NameId);
  iVar7 = Abc_NamStrFindOrAdd(pAVar12,pcVar13,&local_34);
  if (local_34 == 0) {
    if (iVar7 != pNtk->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                    ,0x1f7,"void Cba_NtkAdd(Cba_Man_t *, Cba_Ntk_t *)");
    }
  }
  else {
    Abc_NamStr(pNtk->pDesign->pStrs,pNtk->NameId);
    printf("Network with name \"%s\" already exists.\n");
  }
  p_00 = &pNtk->vObjName;
  uVar11 = (pNtk->vObjType).nCap;
  if ((pNtk->vObjName).nCap < (int)uVar11) {
    piVar14 = (pNtk->vObjName).pArray;
    if (piVar14 == (int *)0x0) {
      piVar14 = (int *)malloc((long)(int)uVar11 << 2);
    }
    else {
      piVar14 = (int *)realloc(piVar14,(long)(int)uVar11 << 2);
    }
    (pNtk->vObjName).pArray = piVar14;
    if (piVar14 == (int *)0x0) goto LAB_003da234;
    p_00->nCap = uVar11;
  }
  if (0 < (int)uVar11) {
    memset((pNtk->vObjName).pArray,0,(ulong)uVar11 * 4);
  }
  (pNtk->vObjName).nSize = uVar11;
  pVVar15 = pGia->vCis;
  if (0 < pVVar15->nSize) {
    uVar20 = 0;
    do {
      uVar11 = pVVar15->pArray[uVar20];
      if (((int)uVar11 < 0) || (iVar7 = pGia->nObjs, iVar7 <= (int)uVar11)) goto LAB_003da0ca;
      if ((ulong)uVar11 == 0) goto LAB_003d987a;
      pVVar2 = pGia->vNamesIn;
      if (pVVar2 == (Vec_Ptr_t *)0x0) {
        iVar7 = Cba_NtkNewStrId(pNtk,"i%d",uVar20 & 0xffffffff);
      }
      else {
        if ((long)pVVar2->nSize <= (long)uVar20) goto LAB_003da1f6;
        iVar7 = Abc_NamStrFindOrAdd(p->pStrs,(char *)pVVar2->pArray[uVar20],(int *)0x0);
      }
      uVar8 = Cba_ObjAlloc(pNtk,CBA_OBJ_PI,0,1);
      Cba_ObjSetName(pNtk,uVar8,iVar7);
      if ((int)uVar8 < 1) goto LAB_003da11d;
      if ((pNtk->vObjFon0).nSize <= (int)uVar8) goto LAB_003da08c;
      if (iVar16 <= (int)(uVar11 * 2)) goto LAB_003da17a;
      __s[(ulong)uVar11 * 2] = (pNtk->vObjFon0).pArray[uVar8];
      uVar20 = uVar20 + 1;
      pVVar15 = pGia->vCis;
    } while ((long)uVar20 < (long)pVVar15->nSize);
  }
  iVar7 = pGia->nObjs;
  if (0 < iVar7) {
LAB_003d987a:
    iVar18 = 0;
    lVar21 = 0;
    lVar17 = 0;
    do {
      pGVar3 = pGia->pObjs;
      uVar20 = *(ulong *)(&pGVar3->field_0x0 + lVar21);
      uVar11 = (uint)uVar20;
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        if ((int)((int)lVar17 - (uVar11 & 0x1fffffff)) < 0) goto LAB_003da0f2;
        uVar8 = (uint)(uVar20 >> 0x20) & 0x1fffffff;
        if ((int)((int)lVar17 - uVar8) < 0) goto LAB_003da0f2;
        pGVar1 = (Gia_Obj_t *)(&pGVar3->field_0x0 + lVar21);
        iVar7 = Cba_NtkInsertGiaLit(pNtk,iVar18 + (uint)((uVar11 >> 0x1d & 1) != 0) +
                                         (uVar11 & 0x1fffffff) * -2,vLit2Fon,fUseXor);
        iVar9 = Cba_NtkInsertGiaLit(pNtk,iVar18 + (uint)((uVar20 >> 0x3d & 1) != 0) + uVar8 * -2,
                                    vLit2Fon,fUseXor);
        pGVar4 = pGia->pObjs;
        if ((pGVar1 < pGVar4) || (pGVar4 + pGia->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        puVar5 = pGia->pMuxes;
        if ((puVar5 == (uint *)0x0) ||
           (puVar5[(int)((ulong)((long)pGVar3 + (lVar21 - (long)pGVar4)) >> 2) * -0x55555555] == 0))
        {
          uVar11 = (uint)*(undefined8 *)pGVar1;
          if (((int)uVar11 < 0) || ((uVar11 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaNtk.c"
                          ,0x415,
                          "int Cba_NtkInsertGiaObj(Cba_Ntk_t *, Gia_Man_t *, int, Vec_Int_t *, int)"
                         );
          }
          uVar11 = Cba_ObjAlloc(pNtk,(uint)((uVar11 & 0x1fffffff) <
                                           ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) &
                                           0x1fffffff)) * 4 + CBA_BOX_AND,2,1);
          if ((int)uVar11 < 1) goto LAB_003da13c;
          if ((pNtk->vObjFin0).nSize <= (int)uVar11) goto LAB_003da08c;
          piVar14 = (pNtk->vObjFin0).pArray;
          iVar10 = piVar14[uVar11];
          lVar19 = (long)iVar10;
          if (lVar19 < 1) goto LAB_003da0ab;
          if ((pNtk->vFinFon).nSize <= iVar10) goto LAB_003da08c;
          piVar6 = (pNtk->vFinFon).pArray;
          if (piVar6[lVar19] != 0) goto LAB_003da0e9;
          piVar6[lVar19] = iVar7;
          if ((pNtk->vObjFin0).nSize <= (int)uVar11) goto LAB_003da08c;
          iVar7 = piVar14[uVar11];
          if (iVar7 < 0) goto LAB_003da0ab;
          uVar8 = iVar7 + 1;
          if ((pNtk->vFinFon).nSize <= (int)uVar8) goto LAB_003da08c;
          if (piVar6[uVar8] != 0) goto LAB_003da0e9;
          piVar6[uVar8] = iVar9;
        }
        else {
          iVar10 = Cba_NtkInsertGiaLit(pNtk,-(uint)(puVar5[lVar17] == 0) | puVar5[lVar17],vLit2Fon,
                                       fUseXor);
          uVar11 = Cba_ObjAlloc(pNtk,CBA_BOX_MUX,3,1);
          if ((int)uVar11 < 1) goto LAB_003da13c;
          if ((pNtk->vObjFin0).nSize <= (int)uVar11) goto LAB_003da08c;
          piVar14 = (pNtk->vObjFin0).pArray;
          lVar19 = (long)piVar14[uVar11];
          if (lVar19 < 1) goto LAB_003da0ab;
          if ((pNtk->vFinFon).nSize <= piVar14[uVar11]) goto LAB_003da08c;
          piVar6 = (pNtk->vFinFon).pArray;
          if (piVar6[lVar19] != 0) goto LAB_003da0e9;
          piVar6[lVar19] = iVar10;
          if ((pNtk->vObjFin0).nSize <= (int)uVar11) goto LAB_003da08c;
          if (piVar14[uVar11] < 0) goto LAB_003da0ab;
          uVar8 = piVar14[uVar11] + 1;
          if ((pNtk->vFinFon).nSize <= (int)uVar8) goto LAB_003da08c;
          if (piVar6[uVar8] != 0) goto LAB_003da0e9;
          piVar6[uVar8] = iVar9;
          if ((pNtk->vObjFin0).nSize <= (int)uVar11) goto LAB_003da08c;
          if (piVar14[uVar11] < -1) goto LAB_003da0ab;
          uVar8 = piVar14[uVar11] + 2;
          if ((pNtk->vFinFon).nSize <= (int)uVar8) goto LAB_003da08c;
          if (piVar6[uVar8] != 0) goto LAB_003da0e9;
          piVar6[uVar8] = iVar7;
        }
        if ((pNtk->vObjFon0).nSize <= (int)uVar11) goto LAB_003da08c;
        if (iVar16 <= iVar18) {
LAB_003da17a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar17 * 2] = (pNtk->vObjFon0).pArray[uVar11];
        iVar7 = pGia->nObjs;
      }
      lVar17 = lVar17 + 1;
      lVar21 = lVar21 + 0xc;
      iVar18 = iVar18 + 2;
    } while (lVar17 < iVar7);
  }
  pVVar15 = pGia->vCos;
  uVar20 = (ulong)(uint)pVVar15->nSize;
  if (0 < pVVar15->nSize) {
    lVar17 = 0;
    do {
      iVar16 = (int)uVar20;
      iVar7 = pVVar15->pArray[lVar17];
      if (((long)iVar7 < 0) || (pGia->nObjs <= iVar7)) goto LAB_003da0ca;
      if (iVar7 == 0) break;
      iVar16 = iVar7 - (*(uint *)(pGia->pObjs + iVar7) & 0x1fffffff);
      if (iVar16 < 0) goto LAB_003da0f2;
      Cba_NtkInsertGiaLit(pNtk,(*(uint *)(pGia->pObjs + iVar7) >> 0x1d & 1) + iVar16 * 2,vLit2Fon,
                          fUseXor);
      lVar17 = lVar17 + 1;
      pVVar15 = pGia->vCos;
      iVar16 = pVVar15->nSize;
      uVar20 = (ulong)iVar16;
    } while (lVar17 < (long)uVar20);
    if (0 < iVar16) {
      uVar20 = 0;
      do {
        iVar7 = pVVar15->pArray[uVar20];
        if (((long)iVar7 < 0) || (pGia->nObjs <= iVar7)) {
LAB_003da0ca:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (iVar7 == 0) break;
        iVar16 = iVar7 - (*(uint *)(pGia->pObjs + iVar7) & 0x1fffffff);
        if (iVar16 < 0) {
LAB_003da0f2:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar7 = Cba_NtkInsertGiaLit(pNtk,(*(uint *)(pGia->pObjs + iVar7) >> 0x1d & 1) + iVar16 * 2,
                                    vLit2Fon,fUseXor);
        uVar11 = Cba_ObjAlloc(pNtk,CBA_BOX_BUF,1,1);
        if ((int)uVar11 < 1) goto LAB_003da13c;
        if ((pNtk->vObjFin0).nSize <= (int)uVar11) goto LAB_003da08c;
        iVar16 = (pNtk->vObjFin0).pArray[uVar11];
        lVar17 = (long)iVar16;
        if (lVar17 < 1) goto LAB_003da0ab;
        if ((pNtk->vFinFon).nSize <= iVar16) goto LAB_003da08c;
        piVar14 = (pNtk->vFinFon).pArray;
        if (piVar14[lVar17] != 0) goto LAB_003da0e9;
        piVar14[lVar17] = iVar7;
        if ((pNtk->vObjFon0).nSize <= (int)uVar11) goto LAB_003da08c;
        iVar7 = (pNtk->vObjFon0).pArray[uVar11];
        pVVar2 = pGia->vNamesOut;
        if (pVVar2 == (Vec_Ptr_t *)0x0) {
          iVar16 = Cba_NtkNewStrId(pNtk,"o%d",uVar20 & 0xffffffff);
        }
        else {
          if ((long)pVVar2->nSize <= (long)uVar20) {
LAB_003da1f6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          iVar16 = Abc_NamStrFindOrAdd(p->pStrs,(char *)pVVar2->pArray[uVar20],(int *)0x0);
        }
        uVar11 = Cba_ObjAlloc(pNtk,CBA_OBJ_PO,1,0);
        Cba_ObjSetName(pNtk,uVar11,iVar16);
        if ((int)uVar11 < 1) goto LAB_003da13c;
        if ((pNtk->vObjFin0).nSize <= (int)uVar11) goto LAB_003da08c;
        iVar16 = (pNtk->vObjFin0).pArray[uVar11];
        lVar17 = (long)iVar16;
        if (lVar17 < 1) goto LAB_003da0ab;
        if ((pNtk->vFinFon).nSize <= iVar16) goto LAB_003da08c;
        piVar14 = (pNtk->vFinFon).pArray;
        if (piVar14[lVar17] != 0) goto LAB_003da0e9;
        piVar14[lVar17] = iVar7;
        uVar20 = uVar20 + 1;
        pVVar15 = pGia->vCos;
      } while ((long)uVar20 < (long)pVVar15->nSize);
    }
  }
  pVVar15 = &pNtk->vFonName;
  uVar11 = (pNtk->vFonObj).nCap;
  uVar8 = (pNtk->vFonName).nCap;
  if ((int)uVar8 < (int)uVar11) {
    piVar14 = (pNtk->vFonName).pArray;
    if (piVar14 == (int *)0x0) {
      piVar14 = (int *)malloc((long)(int)uVar11 << 2);
    }
    else {
      piVar14 = (int *)realloc(piVar14,(long)(int)uVar11 << 2);
    }
    (pNtk->vFonName).pArray = piVar14;
    if (piVar14 == (int *)0x0) goto LAB_003da234;
    pVVar15->nCap = uVar11;
    uVar8 = uVar11;
  }
  if (0 < (int)uVar11) {
    memset((pNtk->vFonName).pArray,0,(ulong)uVar11 * 4);
    uVar8 = (pNtk->vFonName).nCap;
  }
  (pNtk->vFonName).nSize = uVar11;
  uVar11 = (pNtk->vFonObj).nCap;
  if ((int)uVar8 < (int)uVar11) {
    piVar14 = (pNtk->vFonName).pArray;
    if (piVar14 == (int *)0x0) {
      piVar14 = (int *)malloc((long)(int)uVar11 << 2);
    }
    else {
      piVar14 = (int *)realloc(piVar14,(long)(int)uVar11 << 2);
    }
    (pNtk->vFonName).pArray = piVar14;
    if (piVar14 == (int *)0x0) {
LAB_003da234:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar15->nCap = uVar11;
  }
  if (0 < (int)uVar11) {
    memset((pNtk->vFonName).pArray,0,(ulong)uVar11 * 4);
  }
  (pNtk->vFonName).nSize = uVar11;
  if (0 < (pNtk->vInputs).nSize) {
    lVar17 = 0;
    do {
      iVar7 = (pNtk->vInputs).pArray[lVar17];
      lVar21 = (long)iVar7;
      if (lVar21 < 1) {
LAB_003da11d:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((pNtk->vObjFon0).nSize <= iVar7) goto LAB_003da08c;
      if ((pNtk->vFonName).nSize < 1) goto LAB_003da111;
      uVar11 = (pNtk->vObjFon0).pArray[lVar21];
      if ((int)uVar11 < 1) {
        pcVar13 = "Cba_FonIsReal(f)";
        goto LAB_003da1a0;
      }
      Vec_IntFillExtra(pVVar15,uVar11 + 1,0);
      if ((pNtk->vFonName).nSize <= (int)uVar11) goto LAB_003da08c;
      if ((pNtk->vFonName).pArray[uVar11] == 0) {
        if ((pNtk->vObjName).nSize < 1) goto LAB_003da1d7;
        Vec_IntFillExtra(p_00,iVar7 + 1,0);
        if ((pNtk->vObjName).nSize <= iVar7) goto LAB_003da08c;
        Cba_FonSetName(pNtk,uVar11,(pNtk->vObjName).pArray[lVar21]);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pNtk->vInputs).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar17 = 0;
    do {
      iVar7 = (pNtk->vOutputs).pArray[lVar17];
      lVar21 = (long)iVar7;
      if (lVar21 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xfe,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((pNtk->vObjFin0).nSize <= iVar7) {
LAB_003da08c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar16 = (pNtk->vObjFin0).pArray[lVar21];
      if ((long)iVar16 < 1) {
LAB_003da0ab:
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                      ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((pNtk->vFinFon).nSize <= iVar16) goto LAB_003da08c;
      iVar16 = (pNtk->vFinFon).pArray[iVar16];
      if (0 < (long)iVar16) {
        if ((pNtk->vFonName).nSize < 1) {
LAB_003da111:
          pcVar13 = "Cba_NtkHasFonNames(p)";
LAB_003da1a0:
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                        ,0x11d,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(pVVar15,iVar16 + 1,0);
        if ((pNtk->vFonName).nSize <= iVar16) goto LAB_003da08c;
        if ((pNtk->vFonName).pArray[iVar16] == 0) {
          if ((pNtk->vObjName).nSize < 1) {
LAB_003da1d7:
            __assert_fail("Cba_NtkHasObjNames(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                          ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
          }
          Vec_IntFillExtra(p_00,iVar7 + 1,0);
          if ((pNtk->vObjName).nSize <= iVar7) goto LAB_003da08c;
          Cba_FonSetName(pNtk,iVar16,(pNtk->vObjName).pArray[lVar21]);
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < (pNtk->vOutputs).nSize);
  }
  Cba_NtkAddMissingFonNames(pNtk,"a");
  if (__s != (int *)0x0) {
    free(__s);
  }
  free(vLit2Fon);
  return p;
LAB_003da13c:
  pcVar13 = "i>0";
  goto LAB_003da143;
LAB_003da0e9:
  pcVar13 = "Cba_ObjFinFon(p, i, k)== 0";
LAB_003da143:
  __assert_fail(pcVar13,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                ,0x101,"void Cba_ObjSetFinFon(Cba_Ntk_t *, int, int, int)");
}

Assistant:

Cba_Man_t * Cba_ManDeriveFromGia( Cba_Man_t * pOld, Gia_Man_t * pGia, int fUseXor )
{
    Cba_Man_t * p = Cba_ManAlloc( pGia->pSpec, 1, pOld ? Abc_NamRef(pOld->pStrs) : NULL, pOld ? Abc_NamRef(pOld->pFuns) : NULL, NULL, NULL );
    Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Abc_NamStrFindOrAdd(p->pStrs, pGia->pName, NULL), Gia_ManCiNum(pGia), Gia_ManCoNum(pGia), 1000, 2000, 2000 );
    Vec_Int_t * vLit2Fon = Vec_IntStartFull( 2*Gia_ManObjNum(pGia) );
    int i, iObj, iObjNew, NameId, iLit0, iFon0;
    Gia_Obj_t * pObj;
    //Cba_ManPrepareTypeNames( p );
    Cba_NtkAdd( p, pNtk );
    Cba_NtkCleanObjNames( pNtk );
    Gia_ManForEachCiId( pGia, iObj, i )
    {
        NameId = pGia->vNamesIn? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesIn, i), NULL) : Cba_NtkNewStrId(pNtk, "i%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Vec_IntWriteEntry( vLit2Fon, Abc_Var2Lit(iObj, 0), Cba_ObjFon0(pNtk, iObjNew) );
    }
    Gia_ManForEachAndId( pGia, iObj )
        Cba_NtkInsertGiaObj( pNtk, pGia, iObj, vLit2Fon, fUseXor );
    // create inverters if needed
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
    }
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
        iObjNew = Cba_ObjAlloc( pNtk, CBA_BOX_BUF, 1, 1 );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
        iFon0 = Cba_ObjFon0(pNtk, iObjNew); // non-const fon unique for this output
        NameId = pGia->vNamesOut? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesOut, i), NULL) : Cba_NtkNewStrId(pNtk, "o%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
    }
    Cba_NtkCleanFonNames( pNtk );
    Cba_NtkCreateFonNames( pNtk, "a" );
    Vec_IntFree( vLit2Fon );
    return p;
}